

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::freeAll(StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
          *this)

{
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar1;
  uint uVar2;
  int ii;
  ulong uVar3;
  long lVar4;
  int jj;
  ulong uVar5;
  
  if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
    uVar3 = (ulong)(uint)this->bsize;
    lVar4 = uVar3 * 8;
    while( true ) {
      if ((int)uVar3 < 1) break;
      std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::~unique_ptr
                ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                 ((long)&this->dataptr[this->dataSlotIndex][-1]._M_t.
                         super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                         .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl + lVar4));
      uVar3 = (ulong)((int)uVar3 - 1);
      lVar4 = lVar4 + -8;
    }
    uVar2 = this->dataSlotIndex;
    if (0 < (long)(int)uVar2) {
      operator_delete(this->dataptr[(int)uVar2],0x100);
      uVar2 = this->dataSlotIndex;
    }
    uVar3 = (ulong)uVar2;
    while (0 < (int)uVar3) {
      uVar3 = uVar3 - 1;
      uVar5 = 0x1f;
      while( true ) {
        if ((int)uVar5 < 0) break;
        std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::~unique_ptr
                  (this->dataptr[uVar3] + uVar5);
        uVar5 = (ulong)((int)uVar5 - 1);
      }
      operator_delete(this->dataptr[uVar3],0x100);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x100);
    }
    for (lVar4 = 0; ppuVar1 = this->freeblocks, lVar4 < this->freeIndex; lVar4 = lVar4 + 1) {
      operator_delete(ppuVar1[lVar4],0x100);
    }
    if (ppuVar1 != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      operator_delete__(ppuVar1);
    }
    if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }